

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O0

arguments *
nonius::detail::
parse_arguments<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
          (option_set *options,
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          first,__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                last)

{
  bool bVar1;
  reference args_00;
  argument_error *this;
  string *in_RCX;
  size_type in_RSI;
  option *in_RDI;
  string arg;
  option *option;
  const_iterator __end3;
  const_iterator __begin3;
  option_set *__range3;
  bool parsed;
  arguments *args;
  vector<nonius::detail::option,_std::allocator<nonius::detail::option>_> *in_stack_ffffffffffffff38
  ;
  string *in_stack_ffffffffffffff40;
  option *o;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  reference args_01;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  last_00;
  undefined1 local_80 [24];
  undefined8 in_stack_ffffffffffffff98;
  string *in_stack_ffffffffffffffa0;
  option *in_stack_ffffffffffffffa8;
  const_iterator local_38;
  undefined8 local_30;
  undefined1 local_22;
  undefined1 local_21;
  size_type local_20;
  string *local_18;
  
  local_21 = '\0';
  last_00._M_current = &in_RDI->long_form;
  local_20 = in_RSI;
  local_18 = in_RCX;
  std::
  unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::unordered_multimap
            ((unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)0x20a921);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_ffffffffffffff40,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_ffffffffffffff38);
    if (!bVar1) {
      return (arguments *)in_RDI;
    }
    local_22 = 0;
    local_30 = local_20;
    local_38 = std::vector<nonius::detail::option,_std::allocator<nonius::detail::option>_>::begin
                         (in_stack_ffffffffffffff38);
    std::vector<nonius::detail::option,_std::allocator<nonius::detail::option>_>::end
              (in_stack_ffffffffffffff38);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_nonius::detail::option_*,_std::vector<nonius::detail::option,_std::allocator<nonius::detail::option>_>_>
                               *)in_stack_ffffffffffffff40,
                              (__normal_iterator<const_nonius::detail::option_*,_std::vector<nonius::detail::option,_std::allocator<nonius::detail::option>_>_>
                               *)in_stack_ffffffffffffff38), bVar1) {
      args_00 = __gnu_cxx::
                __normal_iterator<const_nonius::detail::option_*,_std::vector<nonius::detail::option,_std::allocator<nonius::detail::option>_>_>
                ::operator*(&stack0xffffffffffffffc8);
      args_01 = args_00;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator*((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&stack0xfffffffffffffff0);
      in_stack_ffffffffffffff6f =
           detail::option::matches_short
                     ((option *)last_00._M_current,
                      (string *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
      if ((bool)in_stack_ffffffffffffff6f) {
        in_stack_ffffffffffffffa0 = local_18;
        parse_short<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  ((option *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
                   (arguments *)args_01,
                   (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58),last_00);
        local_22 = 1;
      }
      else {
        o = (option *)local_80;
        std::__cxx11::string::string((string *)o);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator*((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&stack0xfffffffffffffff0);
        in_stack_ffffffffffffff5f =
             detail::option::matches_long
                       (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                        (string *)in_stack_ffffffffffffff98);
        if ((bool)in_stack_ffffffffffffff5f) {
          parse_long(o,(arguments *)args_00,in_stack_ffffffffffffff40);
          local_22 = 1;
        }
        std::__cxx11::string::~string((string *)local_80);
      }
      __gnu_cxx::
      __normal_iterator<const_nonius::detail::option_*,_std::vector<nonius::detail::option,_std::allocator<nonius::detail::option>_>_>
      ::operator++(&stack0xffffffffffffffc8);
    }
    if ((local_22 & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&stack0xfffffffffffffff0);
  }
  this = (argument_error *)__cxa_allocate_exception(8);
  this->_vptr_argument_error = (_func_int **)0x0;
  argument_error::argument_error(this);
  __cxa_throw(this,&argument_error::typeinfo,argument_error::~argument_error);
}

Assistant:

arguments parse_arguments(option_set const& options, Iterator first, Iterator last) {
            arguments args;
            for(; first != last; ++first) {
                bool parsed = false;
                for(auto&& option : options) {
                    if(option.matches_short(*first)) {
                        parse_short(option, args, first, last);
                        parsed = true;
                    } else {
                        std::string arg;
                        if(option.matches_long(*first, arg)) {
                            parse_long(option, args, std::move(arg));
                            parsed = true;
                        }
                    }
                }
                if(!parsed) {
                    throw argument_error();
                }
            }
            return args;
        }